

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<Fad<double>_> * __thiscall
Fad<Fad<double>>::operator=
          (Fad<Fad<double>> *this,
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
          *fadexpr)

{
  uint uVar1;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
  *pFVar2;
  FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>
  *pFVar3;
  Fad<Fad<double>_> *pFVar4;
  bool bVar5;
  double *pdVar6;
  uint ssize;
  ulong uVar7;
  value_type local_58;
  Fad<Fad<double>_> *local_38;
  
  pFVar2 = (fadexpr->fadexpr_).left_;
  pFVar3 = (pFVar2->fadexpr_).left_;
  uVar1 = *(uint *)(**(long **)(((pFVar3->fadexpr_).left_)->fadexpr_).expr_ + 0x28);
  ssize = (((pFVar3->fadexpr_).right_)->dx_).num_elts;
  if ((int)ssize < (int)uVar1) {
    ssize = uVar1;
  }
  uVar1 = (((pFVar2->fadexpr_).right_)->dx_).num_elts;
  if ((int)ssize <= (int)uVar1) {
    ssize = uVar1;
  }
  uVar1 = (((fadexpr->fadexpr_).right_)->dx_).num_elts;
  if ((int)ssize <= (int)uVar1) {
    ssize = uVar1;
  }
  if (ssize != *(uint *)(this + 0x28)) {
    Vector<Fad<double>_>::resize((Vector<Fad<double>_> *)(this + 0x28),ssize);
  }
  local_38 = (Fad<Fad<double>_> *)this;
  if (ssize != 0) {
    pdVar6 = *(double **)(this + 0x30);
    bVar5 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
            ::hasFastAccess(&fadexpr->fadexpr_);
    if (bVar5) {
      if (0 < (int)ssize) {
        uVar7 = 0;
        do {
          FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
          ::fastAccessDx(&local_58,&fadexpr->fadexpr_,(int)uVar7);
          *pdVar6 = local_58.val_;
          Vector<double>::operator=((Vector<double> *)(pdVar6 + 1),&local_58.dx_);
          pdVar6[3] = local_58.defaultVal;
          Fad<double>::~Fad(&local_58);
          uVar7 = uVar7 + 1;
          pdVar6 = pdVar6 + 4;
        } while (ssize != uVar7);
      }
    }
    else if (0 < (int)ssize) {
      uVar7 = 0;
      do {
        FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
        ::dx(&local_58,&fadexpr->fadexpr_,(int)uVar7);
        *pdVar6 = local_58.val_;
        Vector<double>::operator=((Vector<double> *)(pdVar6 + 1),&local_58.dx_);
        pdVar6[3] = local_58.defaultVal;
        Fad<double>::~Fad(&local_58);
        uVar7 = uVar7 + 1;
        pdVar6 = pdVar6 + 4;
      } while (ssize != uVar7);
    }
  }
  FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
  ::val(&local_58,&fadexpr->fadexpr_);
  pFVar4 = local_38;
  (local_38->val_).val_ = local_58.val_;
  Vector<double>::operator=(&(local_38->val_).dx_,&local_58.dx_);
  (pFVar4->val_).defaultVal = local_58.defaultVal;
  Fad<double>::~Fad(&local_58);
  return pFVar4;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}